

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall QZipStreamStrategy::QZipStreamStrategy(QZipStreamStrategy *this,QIODevice *device)

{
  QIODevice *in_RSI;
  QOutputStrategy *in_RDI;
  QOutputStrategy *this_00;
  QIODevice **this_01;
  int *this_02;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArray mime;
  QString *in_stack_fffffffffffffcf8;
  QString *in_stack_fffffffffffffd00;
  QString *in_stack_fffffffffffffd08;
  QAnyStringView *this_03;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 uVar11;
  QIODevice *this_04;
  QZipStreamStrategy *this_05;
  storage_type *local_230;
  undefined1 local_220 [24];
  storage_type *local_208;
  undefined1 local_1f8 [24];
  storage_type *local_1e0;
  undefined1 local_1d0 [24];
  storage_type *local_1b8;
  undefined1 local_1a8 [24];
  storage_type *local_190;
  undefined1 local_180 [40];
  storage_type *local_158;
  undefined1 local_148 [40];
  QAnyStringView *local_120;
  QAnyStringView *local_118;
  storage_type *local_110;
  undefined1 local_100 [40];
  QAnyStringView *local_d8;
  storage_type *local_c8;
  undefined1 local_b8 [40];
  QAnyStringView *local_90;
  storage_type *local_80;
  undefined1 local_70 [48];
  undefined1 local_40 [24];
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QOutputStrategy::QOutputStrategy(in_RDI);
  in_RDI->_vptr_QOutputStrategy = (_func_int **)&PTR__QZipStreamStrategy_00e23248;
  this_00 = in_RDI + 1;
  this_03 = (QAnyStringView *)0x0;
  QBuffer::QBuffer((QBuffer *)this_00,(QObject *)0x0);
  this_04 = (QIODevice *)&in_RDI[1].counter;
  QBuffer::QBuffer((QBuffer *)this_04,(QObject *)this_03);
  this_01 = &in_RDI[2].contentStream;
  QZipWriter::QZipWriter((QZipWriter *)this_01,in_RSI);
  this_02 = &in_RDI[2].counter;
  QXmlStreamWriter::QXmlStreamWriter((QXmlStreamWriter *)this_02,this_04);
  QString::QString((QString *)0x9f7814);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_28,"application/vnd.oasis.opendocument.text",-1);
  QZipWriter::setCompressionPolicy((CompressionPolicy)this_01);
  QByteArrayView::QByteArrayView<9ul>
            ((QByteArrayView *)this_03,(char (*) [9])in_stack_fffffffffffffd08);
  QVar1.m_data = (storage_type *)local_70._32_8_;
  QVar1.m_size = (qsizetype)local_40;
  QString::fromLatin1(QVar1);
  QZipWriter::addFile((QString *)this_01,(QByteArray *)local_40);
  QString::~QString((QString *)0x9f78ca);
  uVar11 = 2;
  QZipWriter::setCompressionPolicy((CompressionPolicy)this_01);
  in_RDI->contentStream = (QIODevice *)this_00;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffd00,
             (OpenModeFlag)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  QBuffer::open((QFlags_conflict *)this_00);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffd00,
             (OpenModeFlag)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  QBuffer::open((QFlags_conflict *)this_04);
  QByteArrayView::QByteArrayView<51ul>
            ((QByteArrayView *)this_03,(char (*) [51])in_stack_fffffffffffffd08);
  this_05 = (QZipStreamStrategy *)local_70;
  QVar2.m_data = local_80;
  QVar2.m_size = (qsizetype)this_05;
  QString::fromLatin1(QVar2);
  QString::operator=(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  QString::~QString((QString *)0x9f7981);
  QXmlStreamWriter::setAutoFormatting(SUB81(this_02,0));
  QXmlStreamWriter::setAutoFormattingIndent((int)this_02);
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QByteArrayView::QByteArrayView<9ul>
            ((QByteArrayView *)this_03,(char (*) [9])in_stack_fffffffffffffd08);
  QVar3.m_data = local_c8;
  QVar3.m_size = (qsizetype)local_b8;
  QString::fromLatin1(QVar3);
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QXmlStreamWriter::writeNamespace((QAnyStringView *)this_02,local_90);
  QString::~QString((QString *)0x9f7a30);
  QXmlStreamWriter::writeStartDocument();
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QByteArrayView::QByteArrayView<9ul>
            ((QByteArrayView *)this_03,(char (*) [9])in_stack_fffffffffffffd08);
  QVar4.m_data = local_110;
  QVar4.m_size = (qsizetype)local_100;
  QString::fromLatin1(QVar4);
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)this_02,local_d8);
  QString::~QString((QString *)0x9f7ac6);
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QByteArrayView::QByteArrayView<8ul>
            ((QByteArrayView *)this_03,(char (*) [8])in_stack_fffffffffffffd08);
  QVar5.m_data = local_158;
  QVar5.m_size = (qsizetype)local_148;
  QString::fromLatin1(QVar5);
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QByteArrayView::QByteArrayView<4ul>
            ((QByteArrayView *)this_03,(char (*) [4])in_stack_fffffffffffffd08);
  QVar6.m_data = local_190;
  QVar6.m_size = (qsizetype)local_180;
  QString::fromLatin1(QVar6);
  QAnyStringView::QAnyStringView(this_03,in_stack_fffffffffffffd08);
  QXmlStreamWriter::writeAttribute((QAnyStringView *)this_02,local_120,local_118);
  QString::~QString((QString *)0x9f7bb9);
  QString::~QString((QString *)0x9f7bc6);
  QByteArrayView::QByteArrayView<2ul>
            ((QByteArrayView *)this_03,(char (*) [2])in_stack_fffffffffffffd08);
  QVar7.m_data = local_1b8;
  QVar7.m_size = (qsizetype)local_1a8;
  QString::fromLatin1(QVar7);
  QByteArrayView::QByteArrayView<40ul>
            ((QByteArrayView *)this_03,(char (*) [40])in_stack_fffffffffffffd08);
  QVar8.m_data = local_1e0;
  QVar8.m_size = (qsizetype)local_1d0;
  QString::fromLatin1(QVar8);
  addFile(this_05,(QString *)this_04,(QString *)CONCAT44(uVar11,in_stack_fffffffffffffd30));
  QString::~QString((QString *)0x9f7c63);
  QString::~QString((QString *)0x9f7c70);
  QByteArrayView::QByteArrayView<12ul>
            ((QByteArrayView *)this_03,(char (*) [12])in_stack_fffffffffffffd08);
  QVar9.m_data = local_208;
  QVar9.m_size = (qsizetype)local_1f8;
  QString::fromLatin1(QVar9);
  QByteArrayView::QByteArrayView<9ul>
            ((QByteArrayView *)this_03,(char (*) [9])in_stack_fffffffffffffd08);
  QVar10.m_data = local_230;
  QVar10.m_size = (qsizetype)local_220;
  QString::fromLatin1(QVar10);
  addFile(this_05,(QString *)this_04,(QString *)CONCAT44(uVar11,in_stack_fffffffffffffd30));
  QString::~QString((QString *)0x9f7d0c);
  QString::~QString((QString *)0x9f7d19);
  QByteArray::~QByteArray((QByteArray *)0x9f7d26);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QZipStreamStrategy(QIODevice *device)
        : zip(device),
        manifestWriter(&manifest)
    {
        QByteArray mime("application/vnd.oasis.opendocument.text");
        zip.setCompressionPolicy(QZipWriter::NeverCompress);
        zip.addFile(QString::fromLatin1("mimetype"), mime); // for mime-magick
        zip.setCompressionPolicy(QZipWriter::AutoCompress);
        contentStream = &content;
        content.open(QIODevice::WriteOnly);
        manifest.open(QIODevice::WriteOnly);

        manifestNS = QString::fromLatin1("urn:oasis:names:tc:opendocument:xmlns:manifest:1.0");
        // prettyfy
        manifestWriter.setAutoFormatting(true);
        manifestWriter.setAutoFormattingIndent(1);

        manifestWriter.writeNamespace(manifestNS, QString::fromLatin1("manifest"));
        manifestWriter.writeStartDocument();
        manifestWriter.writeStartElement(manifestNS, QString::fromLatin1("manifest"));
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("version"), QString::fromLatin1("1.2"));
        addFile(QString::fromLatin1("/"), QString::fromLatin1("application/vnd.oasis.opendocument.text"));
        addFile(QString::fromLatin1("content.xml"), QString::fromLatin1("text/xml"));
    }